

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.cpp
# Opt level: O1

ssize_t readline::read(int __fd,void *__buf,size_t __nbytes)

{
  char *prompt;
  char cVar1;
  int iVar2;
  char *__s1;
  undefined7 extraout_var;
  ulong uVar3;
  undefined4 in_register_0000003c;
  string *line;
  long lVar4;
  bool bVar5;
  
  line = (string *)CONCAT44(in_register_0000003c,__fd);
  linenoise::LoadHistory(*(char **)__nbytes);
  prompt = *__buf;
  __s1 = getenv("TERM");
  if (__s1 != (char *)0x0) {
    lVar4 = 0;
    do {
      iVar2 = strcasecmp(__s1,*(char **)((long)&linenoise::unsupported_term + lVar4));
      if (iVar2 == 0) break;
      bVar5 = lVar4 != 0x10;
      lVar4 = lVar4 + 8;
    } while (bVar5);
    if (iVar2 == 0) {
      uVar3 = 0;
      printf("%s",prompt);
      fflush(_stdout);
      cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'h');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)line,cVar1);
      goto LAB_00105545;
    }
  }
  bVar5 = linenoise::linenoiseRaw(prompt,line);
  uVar3 = CONCAT71(extraout_var,bVar5) & 0xffffffff;
LAB_00105545:
  if ((char)uVar3 == '\0') {
    linenoise::AddHistory((line->_M_dataplus)._M_p);
    linenoise::SaveHistory(*(char **)__nbytes);
  }
  return uVar3 ^ 1;
}

Assistant:

bool read(std::string& input, const std::string& prompt,
          const std::string& history_path)
{
    linenoise::LoadHistory(history_path.c_str());

    const auto eof = linenoise::Readline(prompt.c_str(), input);

    if (eof)
        return false;

    linenoise::AddHistory(input.c_str());
    linenoise::SaveHistory(history_path.c_str());

    return true;
}